

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::TestTexture1DArray::TestTexture1DArray
          (TestTexture1DArray *this,TextureFormat *format,int width,int arraySize)

{
  Texture1DArray *this_00;
  TestTexture *this_01;
  _Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_30;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture1DArray_00bfb3a8;
  this_00 = &this->m_texture;
  tcu::Texture1DArray::Texture1DArray(this_00,format,width,arraySize);
  allocateLevels<tcu::Texture1DArray>(this_00);
  this_01 = (TestTexture *)&local_30;
  getLevelsVector<tcu::Texture1DArray>
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)this_01,
             this_00);
  TestTexture::populateLevels
            (this_01,(vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                     &local_30);
  std::_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~_Vector_base
            (&local_30);
  return;
}

Assistant:

TestTexture1DArray::TestTexture1DArray (const tcu::TextureFormat& format, int width, int arraySize)
	: TestTexture	(format, width, 1, arraySize)
	, m_texture		(format, width, arraySize)
{
	allocateLevels(m_texture);
	TestTexture::populateLevels(getLevelsVector(m_texture));
}